

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitArrayInit(WasmBinaryBuilder *this,Expression **out,uint32_t code)

{
  undefined8 in_RAX;
  HeapType heapType;
  Expression *pEVar1;
  Expression *child;
  ArrayInit *this_00;
  vector<wasm::Name*,std::allocator<wasm::Name*>> *this_01;
  map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
  *this_02;
  ArrayInitOp AVar2;
  Name *local_60;
  Expression *local_58;
  Expression *local_50;
  Name *local_48;
  Expression **local_40;
  uint32_t local_38;
  undefined4 local_34;
  Index segIdx;
  
  AVar2 = InitData;
  if (code == 0x54) {
    local_34 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  }
  else {
    if (code != 0x55) {
      return false;
    }
    AVar2 = InitElem;
    local_34 = 0;
  }
  local_40 = out;
  heapType = getIndexedHeapType(this);
  local_38 = getU32LEB(this);
  local_58 = popNonVoidExpression(this);
  local_50 = popNonVoidExpression(this);
  pEVar1 = popNonVoidExpression(this);
  child = popNonVoidExpression(this);
  validateHeapTypeUsingChild(this,child,heapType);
  this_00 = (ArrayInit *)MixedArena::allocSpace(&this->wasm->allocator,0x48,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)71>).super_Expression._id = ArrayInitId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)71>).super_Expression.type.id = 0;
  local_48 = &this_00->segment;
  (this_00->segment).super_IString.str._M_len = 0;
  (this_00->segment).super_IString.str._M_str = (char *)0x0;
  this_00->op = AVar2;
  this_00->ref = child;
  this_00->index = pEVar1;
  this_00->offset = local_50;
  this_00->size = local_58;
  ArrayInit::finalize(this_00);
  if ((char)local_34 == '\0') {
    this_02 = &this->elemRefs;
  }
  else {
    this_02 = &this->dataRefs;
  }
  this_01 = (vector<wasm::Name*,std::allocator<wasm::Name*>> *)
            std::
            map<unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Name_*,_std::allocator<wasm::Name_*>_>_>_>_>
            ::operator[](this_02,&local_38);
  local_60 = local_48;
  std::vector<wasm::Name*,std::allocator<wasm::Name*>>::emplace_back<wasm::Name*>(this_01,&local_60)
  ;
  *local_40 = (Expression *)this_00;
  return true;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitArrayInit(Expression*& out, uint32_t code) {
  ArrayInitOp op;
  switch (code) {
    case BinaryConsts::ArrayInitData:
      op = InitData;
      break;
    case BinaryConsts::ArrayInitElem:
      op = InitElem;
      break;
    default:
      return false;
  }
  auto heapType = getIndexedHeapType();
  Index segIdx = getU32LEB();
  auto* size = popNonVoidExpression();
  auto* offset = popNonVoidExpression();
  auto* index = popNonVoidExpression();
  auto* ref = popNonVoidExpression();
  validateHeapTypeUsingChild(ref, heapType);
  auto* built =
    Builder(wasm).makeArrayInit(op, Name(), ref, index, offset, size);
  if (op == InitData) {
    dataRefs[segIdx].push_back(&built->segment);
  } else {
    elemRefs[segIdx].push_back(&built->segment);
  }
  out = built;
  return true;
}